

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

int google::protobuf::internal::anon_unknown_0::
    MicroStringPrevTest_SetInChunksWithExistingState_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest>
  *this_01;
  TestMetaFactoryBase<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
  *meta_factory;
  allocator<char> local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  CodeLocation local_68;
  allocator<char> local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"MicroStringPrevTest",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0x348);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest>
                      (this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::
  TestMetaFactory<google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_SetInChunksWithExistingState_Test>
  ::TestMetaFactory((TestMetaFactory<google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_SetInChunksWithExistingState_Test>
                     *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0x348);
  testing::internal::
  ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest>
  ::AddTestPattern(this_01,"MicroStringPrevTest","SetInChunksWithExistingState",meta_factory,
                   &local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  return 0;
}

Assistant:

TEST_P(MicroStringPrevTest, SetInChunksWithExistingState) {
  str_.SetInChunks(5, arena(), [](auto append) {
    append("C");
    append("H");
    append("U");
    append("N");
    append("K");
  });
  EXPECT_EQ(str_.Get(), "CHUNK");
}